

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int mg_parse_dns(char *buf,int len,mg_dns_message *msg)

{
  uchar *data;
  uint uVar1;
  ulong uVar2;
  mg_dns_resource_record *pmVar3;
  int iVar4;
  
  (msg->pkt).p = buf;
  (msg->pkt).len = (long)len;
  iVar4 = -1;
  if (0xb < len) {
    msg->transaction_id = *(uint16_t *)buf;
    msg->flags = *(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8;
    uVar1 = (uint)(ushort)(*(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8);
    msg->num_questions = uVar1;
    data = (uchar *)(buf + 0xc);
    msg->num_answers = (uint)(ushort)(*(ushort *)(buf + 6) << 8 | *(ushort *)(buf + 6) >> 8);
    if (uVar1 != 0) {
      pmVar3 = msg->questions;
      uVar2 = 0;
      do {
        data = mg_parse_dns_resource_record(data,(uchar *)(buf + len),pmVar3,0);
        if (0x1e < uVar2) break;
        uVar2 = uVar2 + 1;
        pmVar3 = pmVar3 + 1;
      } while ((long)uVar2 < (long)msg->num_questions);
    }
    if (msg->num_answers < 1) {
      iVar4 = 0;
    }
    else {
      pmVar3 = msg->answers;
      iVar4 = 0;
      uVar2 = 0;
      do {
        data = mg_parse_dns_resource_record(data,(uchar *)(buf + len),pmVar3,1);
        if (0x1e < uVar2) {
          return 0;
        }
        uVar2 = uVar2 + 1;
        pmVar3 = pmVar3 + 1;
      } while ((long)uVar2 < (long)msg->num_answers);
    }
  }
  return iVar4;
}

Assistant:

int mg_parse_dns(const char *buf, int len, struct mg_dns_message *msg) {
    struct mg_dns_header *header = (struct mg_dns_header *) buf;
    unsigned char *data = (unsigned char *) buf + sizeof(*header);
    unsigned char *end = (unsigned char *) buf + len;
    int i;
    msg->pkt.p = buf;
    msg->pkt.len = len;

    if (len < (int) sizeof(*header)) {
        return -1; /* LCOV_EXCL_LINE */
    }

    msg->transaction_id = header->transaction_id;
    msg->flags = ntohs(header->flags);
    msg->num_questions = ntohs(header->num_questions);
    msg->num_answers = ntohs(header->num_answers);

    for (i = 0; i < msg->num_questions && i < (int) ARRAY_SIZE(msg->questions);
         i++) {
        data = mg_parse_dns_resource_record(data, end, &msg->questions[i], 0);
    }

    for (i = 0; i < msg->num_answers && i < (int) ARRAY_SIZE(msg->answers); i++) {
        data = mg_parse_dns_resource_record(data, end, &msg->answers[i], 1);
    }

    return 0;
}